

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  FieldDescriptor *in_RCX;
  GeneratorOptions *in_RDX;
  FieldDescriptor *value_field;
  FieldDescriptor *key_field;
  string typed_annotation;
  FieldDescriptor *in_stack_fffffffffffffd98;
  int i32;
  AlphaNum *in_stack_fffffffffffffda0;
  FieldDescriptor *this_00;
  GeneratorOptions *in_stack_fffffffffffffda8;
  FieldDescriptor *in_stack_fffffffffffffdb0;
  AlphaNum *in_stack_fffffffffffffdd8;
  GeneratorOptions *in_stack_fffffffffffffde8;
  Printer *in_stack_fffffffffffffdf0;
  GeneratorOptions *in_stack_fffffffffffffdf8;
  GeneratorOptions *in_stack_fffffffffffffe00;
  undefined4 in_stack_fffffffffffffe08;
  BytesMode in_stack_fffffffffffffe0c;
  GeneratorOptions *in_stack_fffffffffffffe10;
  GeneratorOptions *in_stack_fffffffffffffe18;
  char *in_stack_fffffffffffffe20;
  Printer *in_stack_fffffffffffffe28;
  char (*in_stack_fffffffffffffe40) [14];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  string local_198 [32];
  string local_178 [20];
  undefined1 in_stack_fffffffffffffe9c;
  undefined1 in_stack_fffffffffffffe9d;
  undefined1 in_stack_fffffffffffffe9e;
  undefined1 in_stack_fffffffffffffe9f;
  FieldDescriptor *in_stack_fffffffffffffea0;
  GeneratorOptions *in_stack_fffffffffffffea8;
  BytesMode in_stack_fffffffffffffec0;
  FieldDescriptor local_138 [32];
  string local_118 [32];
  undefined1 local_f8 [80];
  FieldDescriptor *local_a8;
  FieldDescriptor *local_a0;
  _Base_ptr local_98;
  string local_90 [48];
  string local_60 [32];
  string local_40 [32];
  FieldDescriptor *local_20;
  GeneratorOptions *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  bVar1 = anon_unknown_0::HasFieldPresence
                    (in_stack_fffffffffffffda8,(FieldDescriptor *)in_stack_fffffffffffffda0);
  if ((bVar1) &&
     (CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x470c62), CVar2 != CPPTYPE_MESSAGE)) {
    in_stack_fffffffffffffda0 = (AlphaNum *)((ulong)in_stack_fffffffffffffda0 & 0xffffffff00000000);
    in_stack_fffffffffffffd98 =
         (FieldDescriptor *)((ulong)in_stack_fffffffffffffd98 & 0xffffffff00000000);
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,(bool)in_stack_fffffffffffffe9f,
               (bool)in_stack_fffffffffffffe9e,(bool)in_stack_fffffffffffffe9d,
               in_stack_fffffffffffffec0,(bool)in_stack_fffffffffffffe9c);
    in_stack_fffffffffffffe10 = local_18;
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffffe28);
    io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
              ((Printer *)in_stack_fffffffffffffe10,
               (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (char (*) [6])in_stack_fffffffffffffe00,&in_stack_fffffffffffffdf8->output_dir,
               &in_stack_fffffffffffffdf0->variable_delimiter_,
               &in_stack_fffffffffffffde8->output_dir);
    std::__cxx11::string::~string(local_60);
    std::__cxx11::string::~string(local_40);
  }
  else {
    in_stack_fffffffffffffe00 = local_18;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (in_stack_fffffffffffffe18,(FieldDescriptor *)in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe0c,SUB41((uint)in_stack_fffffffffffffe08 >> 0x18,0));
    bVar1 = FieldDescriptor::is_map((FieldDescriptor *)in_stack_fffffffffffffda0);
    in_stack_fffffffffffffe0c = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe0c);
    local_98 = (_Base_ptr)0x7605aa;
    if (bVar1) {
      local_98 = (_Base_ptr)0x7632c7;
    }
    io::Printer::Print<char[5],std::__cxx11::string,char[7],char_const*>
              ((Printer *)in_stack_fffffffffffffe10,
               (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (char (*) [5])in_stack_fffffffffffffe00,&in_stack_fffffffffffffdf8->output_dir,
               &in_stack_fffffffffffffdf0->variable_delimiter_,(char **)in_stack_fffffffffffffde8);
    std::__cxx11::string::~string(local_90);
  }
  bVar1 = FieldDescriptor::is_map((FieldDescriptor *)in_stack_fffffffffffffda0);
  if (bVar1) {
    io::Printer::Print<>(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
    i32 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
  }
  else {
    bVar1 = FieldDescriptor::is_repeated((FieldDescriptor *)0x470e63);
    if (bVar1) {
      io::Printer::Print<>(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
      i32 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
    }
    else {
      bVar1 = anon_unknown_0::HasFieldPresence
                        (in_stack_fffffffffffffda8,(FieldDescriptor *)in_stack_fffffffffffffda0);
      if (bVar1) {
        io::Printer::Print<>(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
        i32 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
      }
      else {
        CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x470ec3);
        in_stack_fffffffffffffdf8 = (GeneratorOptions *)(ulong)(CVar2 - CPPTYPE_INT32);
        switch(in_stack_fffffffffffffdf8) {
        case (GeneratorOptions *)0x0:
        case (GeneratorOptions *)0x1:
        case (GeneratorOptions *)0x2:
        case (GeneratorOptions *)0x3:
          bVar1 = anon_unknown_0::IsIntegralFieldWithStringJSType(in_stack_fffffffffffffd98);
          if (bVar1) {
            io::Printer::Print<>(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
          }
          else {
            io::Printer::Print<>(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
          }
          break;
        case (GeneratorOptions *)0x4:
        case (GeneratorOptions *)0x5:
        case (GeneratorOptions *)0x7:
          io::Printer::Print<>(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
          break;
        case (GeneratorOptions *)0x6:
          io::Printer::Print<>(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
          break;
        case (GeneratorOptions *)0x8:
          io::Printer::Print<>(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
        }
        i32 = (int)((ulong)in_stack_fffffffffffffd98 >> 0x20);
      }
    }
  }
  bVar1 = FieldDescriptor::is_map((FieldDescriptor *)in_stack_fffffffffffffda0);
  if (bVar1) {
    local_a0 = anon_unknown_0::MapFieldKey((FieldDescriptor *)0x470f96);
    local_a8 = anon_unknown_0::MapFieldValue((FieldDescriptor *)0x470fab);
    FieldDescriptor::number(local_20);
    in_stack_fffffffffffffdf0 = (Printer *)local_f8;
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffda0,i32);
    StrCat_abi_cxx11_(in_stack_fffffffffffffdd8);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (in_stack_fffffffffffffdf8,(FieldDescriptor *)in_stack_fffffffffffffdf0);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (in_stack_fffffffffffffdf8,(FieldDescriptor *)in_stack_fffffffffffffdf0);
    this_00 = local_138;
    io::Printer::
    Print<char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[14],std::__cxx11::string>
              (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,
               (char (*) [6])in_stack_fffffffffffffe18,&in_stack_fffffffffffffe10->output_dir,
               (char (*) [12])CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               &in_stack_fffffffffffffe00->output_dir,in_stack_fffffffffffffe40,
               in_stack_fffffffffffffe48);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string(local_118);
    std::__cxx11::string::~string((string *)(local_f8 + 0x30));
    TVar3 = FieldDescriptor::type(in_stack_fffffffffffffdb0);
    in_stack_fffffffffffffde8 = local_18;
    if (TVar3 == TYPE_MESSAGE) {
      FieldDescriptor::message_type(this_00);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (local_18,(Descriptor *)&stack0xfffffffffffffea8);
      io::Printer::Print<char[12],std::__cxx11::string>
                ((Printer *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                 &in_stack_fffffffffffffdf0->variable_delimiter_,&local_18->output_dir);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
      in_stack_fffffffffffffde8 = local_18;
    }
    io::Printer::Print<>(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  }
  else {
    (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
              ((FieldDescriptor *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               SUB81((ulong)in_stack_fffffffffffffe00 >> 0x38,0));
    FieldDescriptor::number(local_20);
    strings::AlphaNum::AlphaNum(in_stack_fffffffffffffda0,i32);
    StrCat_abi_cxx11_(in_stack_fffffffffffffdd8);
    io::Printer::Print<char[7],std::__cxx11::string,char[6],std::__cxx11::string>
              ((Printer *)in_stack_fffffffffffffe10,
               (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08),
               (char (*) [7])in_stack_fffffffffffffe00,&in_stack_fffffffffffffdf8->output_dir,
               &in_stack_fffffffffffffdf0->variable_delimiter_,
               &in_stack_fffffffffffffde8->output_dir);
    std::__cxx11::string::~string(local_198);
    std::__cxx11::string::~string(local_178);
    CVar2 = FieldDescriptor::cpp_type((FieldDescriptor *)0x471291);
    if ((CVar2 != CPPTYPE_MESSAGE) ||
       (bVar1 = FieldDescriptor::is_map((FieldDescriptor *)in_stack_fffffffffffffda0), bVar1)) {
      io::Printer::Print<>(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
    }
    else {
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                (in_stack_fffffffffffffe18,(FieldDescriptor *)in_stack_fffffffffffffe10);
      io::Printer::Print<char[7],std::__cxx11::string>
                ((Printer *)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8,
                 &in_stack_fffffffffffffdf0->variable_delimiter_,
                 &in_stack_fffffffffffffde8->output_dir);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
    }
    io::Printer::Print<>(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  }
  io::Printer::Print<>(in_stack_fffffffffffffdf0,(char *)in_stack_fffffffffffffde8);
  return;
}

Assistant:

void Generator::GenerateClassSerializeBinaryField(
    const GeneratorOptions& options, io::Printer* printer,
    const FieldDescriptor* field) const {
  if (HasFieldPresence(options, field) &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    std::string typed_annotation =
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false,
                              /* bytes_mode = */ BYTES_DEFAULT);
    printer->Print(
        "  f = /** @type {$type$} */ "
        "(jspb.Message.getField(message, $index$));\n",
        "index", JSFieldIndex(field), "type", typed_annotation);
  } else {
    printer->Print(
        "  f = message.get$name$($nolazy$);\n", "name",
        JSGetterName(options, field, BYTES_U8),
        // No lazy creation for maps containers -- fastpath the empty case.
        "nolazy", field->is_map() ? "true" : "");
  }

  // Print an `if (condition)` statement that evaluates to true if the field
  // goes on the wire.
  if (field->is_map()) {
    printer->Print("  if (f && f.getLength() > 0) {\n");
  } else if (field->is_repeated()) {
    printer->Print("  if (f.length > 0) {\n");
  } else {
    if (HasFieldPresence(options, field)) {
      printer->Print("  if (f != null) {\n");
    } else {
      // No field presence: serialize onto the wire only if value is
      // non-default.  Defaults are documented here:
      // https://goto.google.com/lhdfm
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64: {
          if (IsIntegralFieldWithStringJSType(field)) {
            // We can use `parseInt` here even though it will not be precise for
            // 64-bit quantities because we are only testing for zero/nonzero,
            // and JS numbers (64-bit floating point values, i.e., doubles) are
            // integer-precise in the range that includes zero.
            printer->Print("  if (parseInt(f, 10) !== 0) {\n");
          } else {
            printer->Print("  if (f !== 0) {\n");
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_ENUM:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_DOUBLE:
          printer->Print("  if (f !== 0.0) {\n");
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          printer->Print("  if (f) {\n");
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          printer->Print("  if (f.length > 0) {\n");
          break;
        default:
          assert(false);
          break;
      }
    }
  }

  // Write the field on the wire.
  if (field->is_map()) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "    f.serializeBinary($index$, writer, "
        "$keyWriterFn$, $valueWriterFn$",
        "index", StrCat(field->number()), "keyWriterFn",
        JSBinaryWriterMethodName(options, key_field), "valueWriterFn",
        JSBinaryWriterMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.serializeBinaryToWriter", "messageType",
                     GetMessagePath(options, value_field->message_type()));
    }

    printer->Print(");\n");
  } else {
    printer->Print(
        "    writer.write$method$(\n"
        "      $index$,\n"
        "      f",
        "method", JSBinaryReadWriteMethodName(field, /* is_writer = */ true),
        "index", StrCat(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !field->is_map()) {
      printer->Print(
          ",\n"
          "      $submsg$.serializeBinaryToWriter\n",
          "submsg", SubmessageTypeRef(options, field));
    } else {
      printer->Print("\n");
    }

    printer->Print("    );\n");
  }

  // Close the `if`.
  printer->Print("  }\n");
}